

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

DataSegment * wasm::ModuleUtils::copyDataSegment(DataSegment *segment,Module *out)

{
  bool bVar1;
  int iVar2;
  pointer pDVar3;
  undefined4 extraout_var;
  DataSegment *pDVar4;
  Name memory;
  Name name;
  Expression *offset;
  Address local_48;
  undefined1 local_40 [16];
  Name local_30;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> local_20;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> ret;
  Module *out_local;
  DataSegment *segment_local;
  
  ret._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
       (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)out;
  wasm::Name::Name(&local_30,"");
  wasm::Name::Name((Name *)local_40,"");
  wasm::Address::Address(&local_48,0);
  memory.super_IString.str._M_str = (char *)local_40._0_8_;
  memory.super_IString.str._M_len = (size_t)local_30.super_IString.str._M_str;
  name.super_IString.str._M_str = (char *)local_30.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_20;
  Builder::makeDataSegment
            (name,memory,(bool)local_40[8],(Expression *)0x0,(char *)0x0,(Address)0x218005f);
  pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_20);
  wasm::Name::operator=((Name *)pDVar3,(Name *)segment);
  bVar1 = (segment->super_Named).hasExplicitName;
  pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_20);
  (pDVar3->super_Named).hasExplicitName = (bool)(bVar1 & 1);
  pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_20);
  wasm::Name::operator=(&pDVar3->memory,&segment->memory);
  bVar1 = segment->isPassive;
  pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_20);
  pDVar3->isPassive = (bool)(bVar1 & 1);
  if ((segment->isPassive & 1U) == 0) {
    iVar2 = ExpressionManipulator::copy
                      ((EVP_PKEY_CTX *)segment->offset,
                       (EVP_PKEY_CTX *)
                       ret._M_t.
                       super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                       .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
    pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (&local_20);
    pDVar3->offset = (Expression *)CONCAT44(extraout_var,iVar2);
  }
  pDVar3 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_20);
  std::vector<char,_std::allocator<char>_>::operator=(&pDVar3->data,&segment->data);
  pDVar4 = Module::addDataSegment
                     ((Module *)
                      ret._M_t.
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl,&local_20);
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
            (&local_20);
  return pDVar4;
}

Assistant:

inline DataSegment* copyDataSegment(const DataSegment* segment, Module& out) {
  auto ret = Builder::makeDataSegment();
  ret->name = segment->name;
  ret->hasExplicitName = segment->hasExplicitName;
  ret->memory = segment->memory;
  ret->isPassive = segment->isPassive;
  if (!segment->isPassive) {
    auto offset = ExpressionManipulator::copy(segment->offset, out);
    ret->offset = offset;
  }
  ret->data = segment->data;

  return out.addDataSegment(std::move(ret));
}